

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

LY_ERR lyht_find_next_with_collision_cb
                 (ly_ht *ht,void *val_p,uint32_t hash,lyht_value_equal_cb val_equal,void **match_p)

{
  ly_bool lVar1;
  LY_ERR LVar2;
  uint32_t uVar3;
  lyht_value_equal_cb val_equal_00;
  uint32_t i;
  ly_ht_rec *local_40;
  uint32_t local_34;
  
  val_equal_00 = val_equal;
  if (val_equal == (lyht_value_equal_cb)0x0) {
    val_equal_00 = ht->val_equal;
  }
  LVar2 = lyht_find_rec(ht,val_p,hash,'\x01',val_equal_00,&local_34,&local_40);
  if (LVar2 == LY_SUCCESS) {
    uVar3 = local_40->next;
    local_40 = (ly_ht_rec *)(ht->recs + ht->rec_size * uVar3);
    LVar2 = LY_ENOTFOUND;
    while (uVar3 != 0xffffffff) {
      if (local_40->hash == hash) {
        if (val_equal == (lyht_value_equal_cb)0x0) {
          lVar1 = (*ht->val_equal)(val_p,local_40->val,'\0',ht->cb_data);
        }
        else {
          lVar1 = (*val_equal)(val_p,local_40->val,'\0',ht->cb_data);
        }
        if (lVar1 != '\0') {
          if (match_p == (void **)0x0) {
            return LY_SUCCESS;
          }
          *match_p = local_40->val;
          return LY_SUCCESS;
        }
      }
      uVar3 = local_40->next;
      local_40 = (ly_ht_rec *)(ht->recs + ht->rec_size * uVar3);
    }
  }
  else {
    LVar2 = LY_EINT;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/hash_table.c",
           0x141);
  }
  return LVar2;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyht_find_next_with_collision_cb(const struct ly_ht *ht, void *val_p, uint32_t hash,
        lyht_value_equal_cb val_equal, void **match_p)
{
    struct ly_ht_rec *rec;
    uint32_t rec_idx;
    uint32_t i;

    /* find the record of the previously found value */
    if (lyht_find_rec(ht, val_p, hash, 1, val_equal ? val_equal : ht->val_equal, &i, &rec)) {
        /* not found, cannot happen */
        LOGINT_RET(NULL);
    }

    for (rec_idx = rec->next, rec = lyht_get_rec(ht->recs, ht->rec_size, rec_idx);
            rec_idx != LYHT_NO_RECORD;
            rec_idx = rec->next, rec = lyht_get_rec(ht->recs, ht->rec_size, rec_idx)) {

        if (rec->hash != hash) {
            continue;
        }

        if (val_equal) {
            if (val_equal(val_p, &rec->val, 0, ht->cb_data)) {
                /* even the value matches */
                if (match_p) {
                    *match_p = rec->val;
                }
                return LY_SUCCESS;
            }
        } else if (ht->val_equal(val_p, &rec->val, 0, ht->cb_data)) {
            /* even the value matches */
            if (match_p) {
                *match_p = rec->val;
            }
            return LY_SUCCESS;
        }
    }

    /* the last equal value was already returned */
    return LY_ENOTFOUND;
}